

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

void ary::fillPolygon(Mat *image,
                     vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *points,
                     Scalar *value)

{
  float fVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference pvVar4;
  reference this;
  Point_<int> local_88;
  _InputOutputArray local_80;
  reference local_68;
  Point *mask_points_ptr;
  int local_54;
  undefined4 local_50;
  int i;
  int mask_npoints;
  allocator<cv::Point_<int>_> local_39;
  undefined1 local_38 [8];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> mask_points;
  Scalar *value_local;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *points_local;
  Mat *image_local;
  
  mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  sVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size(points);
  std::allocator<cv::Point_<int>_>::allocator(&local_39);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_38,sVar2,&local_39)
  ;
  std::allocator<cv::Point_<int>_>::~allocator(&local_39);
  sVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size(points);
  local_50 = (undefined4)sVar2;
  local_54 = 0;
  while( true ) {
    uVar3 = (ulong)local_54;
    sVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size(points);
    if (sVar2 <= uVar3) break;
    pvVar4 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                       (points,(long)local_54);
    fVar1 = pvVar4->x;
    pvVar4 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                       (points,(long)local_54);
    cv::Point_<int>::Point_((Point_<int> *)((long)&mask_points_ptr + 4),(int)fVar1,(int)pvVar4->y);
    this = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                     ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_38,
                      (long)local_54);
    cv::Point_<int>::operator=(this,(Point_<int> *)((long)&mask_points_ptr + 4));
    local_54 = local_54 + 1;
  }
  local_68 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                       ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_38,0);
  cv::_InputOutputArray::_InputOutputArray(&local_80,image);
  cv::Point_<int>::Point_(&local_88);
  cv::fillPoly(&local_80,&local_68,&local_50,1,value,8,0,&local_88);
  cv::_InputOutputArray::~_InputOutputArray(&local_80);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_38);
  return;
}

Assistant:

void fillPolygon(Mat& image, const vector<Point2f>& points, Scalar value) {

	vector<Point> mask_points(points.size());
	int mask_npoints = points.size();
	for (int i = 0; i < points.size(); i++) {
		mask_points[i] = Point(points[i].x, points[i].y);
	}
	const Point* mask_points_ptr = &(mask_points[0]);
	fillPoly(image, &mask_points_ptr, &mask_npoints, 1, value);

}